

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O2

int yaml_emitter_emit_flow_sequence_item(yaml_emitter_t *emitter,yaml_event_t *event,int first)

{
  yaml_emitter_state_t **top;
  int *piVar1;
  int iVar2;
  yaml_emitter_state_t *pyVar3;
  
  if (first == 0) {
    if (event->type == YAML_SEQUENCE_END_EVENT) {
      iVar2 = emitter->flow_level + -1;
      goto LAB_001073ff;
    }
    iVar2 = yaml_emitter_write_indicator(emitter,",",0,0,0);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    iVar2 = yaml_emitter_write_indicator(emitter,"[",1,1,0);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = yaml_emitter_increase_indent(emitter,1,0);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = emitter->flow_level;
    emitter->flow_level = iVar2 + 1;
    if (event->type == YAML_SEQUENCE_END_EVENT) {
LAB_001073ff:
      piVar1 = (emitter->indents).top;
      emitter->flow_level = iVar2;
      (emitter->indents).top = piVar1 + -1;
      emitter->indent = piVar1[-1];
      if ((first == 0) && (emitter->canonical != 0)) {
        iVar2 = yaml_emitter_write_indicator(emitter,",",0,0,0);
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = yaml_emitter_write_indent(emitter);
        if (iVar2 == 0) {
          return 0;
        }
      }
      iVar2 = yaml_emitter_write_indicator(emitter,"]",0,0,0);
      if (iVar2 != 0) {
        pyVar3 = (emitter->states).top;
        (emitter->states).top = pyVar3 + -1;
        emitter->state = pyVar3[-1];
        return 1;
      }
      return 0;
    }
  }
  if (((emitter->canonical != 0) || (emitter->best_width < emitter->column)) &&
     (iVar2 = yaml_emitter_write_indent(emitter), iVar2 == 0)) {
    return 0;
  }
  pyVar3 = (emitter->states).top;
  if (pyVar3 == (emitter->states).end) {
    top = &(emitter->states).top;
    iVar2 = yaml_stack_extend(&(emitter->states).start,top,&(emitter->states).end);
    if (iVar2 == 0) {
      emitter->error = YAML_MEMORY_ERROR;
      return 0;
    }
    pyVar3 = *top;
  }
  (emitter->states).top = pyVar3 + 1;
  *pyVar3 = YAML_EMIT_FLOW_SEQUENCE_ITEM_STATE;
  iVar2 = yaml_emitter_emit_node(emitter,event,0,1,0,0);
  return iVar2;
}

Assistant:

static int
yaml_emitter_emit_flow_sequence_item(yaml_emitter_t *emitter,
        yaml_event_t *event, int first)
{
    if (first)
    {
        if (!yaml_emitter_write_indicator(emitter, "[", 1, 1, 0))
            return 0;
        if (!yaml_emitter_increase_indent(emitter, 1, 0))
            return 0;
        emitter->flow_level ++;
    }

    if (event->type == YAML_SEQUENCE_END_EVENT)
    {
        emitter->flow_level --;
        emitter->indent = POP(emitter, emitter->indents);
        if (emitter->canonical && !first) {
            if (!yaml_emitter_write_indicator(emitter, ",", 0, 0, 0))
                return 0;
            if (!yaml_emitter_write_indent(emitter))
                return 0;
        }
        if (!yaml_emitter_write_indicator(emitter, "]", 0, 0, 0))
            return 0;
        emitter->state = POP(emitter, emitter->states);

        return 1;
    }

    if (!first) {
        if (!yaml_emitter_write_indicator(emitter, ",", 0, 0, 0))
            return 0;
    }

    if (emitter->canonical || emitter->column > emitter->best_width) {
        if (!yaml_emitter_write_indent(emitter))
            return 0;
    }
    if (!PUSH(emitter, emitter->states, YAML_EMIT_FLOW_SEQUENCE_ITEM_STATE))
        return 0;

    return yaml_emitter_emit_node(emitter, event, 0, 1, 0, 0);
}